

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

void do_decode(string *inp,FreqTable *freqs,unordered_map<string,_char2double> *tMap,
              unordered_map<string,_vector<string>_> *motif,json *config,int *codewordLen,
              list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *results,mutex *res_lock)

{
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this;
  unique_lock<std::mutex> uLock;
  SeqEntry dec;
  ECdecoding ecDec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string metric_str;
  json *in_stack_00000b00;
  unordered_map<string,_vector<string>_> *in_stack_00000b08;
  int in_stack_00000b14;
  ECdecoding *in_stack_00000b18;
  mutex_type *in_stack_fffffffffffffa78;
  SeqEntry *in_stack_fffffffffffffa80;
  double in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  _Alloc_hider in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb20;
  json *in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb97;
  unordered_map<string,_char2double> *in_stack_fffffffffffffb98;
  FreqTable *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  ECdecoding *in_stack_fffffffffffffbb0;
  allocator<char> local_51 [81];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
             (allocator<char> *)in_stack_fffffffffffffab0._M_p);
  std::allocator<char>::~allocator(local_51);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x16c207);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  ECdecoding::ECdecoding
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
             in_stack_fffffffffffffb98,(bool)in_stack_fffffffffffffb97,in_stack_fffffffffffffb88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa80);
  ECdecoding::decode(in_stack_00000b18,in_stack_00000b14,in_stack_00000b08,in_stack_00000b00);
  std::__cxx11::to_string(in_stack_fffffffffffffa88);
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffab0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffad0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffac8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa80);
  this = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *)BitOutStream::get_data((BitOutStream *)&stack0xfffffffffffffb88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  SeqEntry::~SeqEntry(in_stack_fffffffffffffa80);
  ECdecoding::~ECdecoding((ECdecoding *)in_stack_fffffffffffffa80);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::emplace_back<std::__cxx11::string&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (this,__args,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa80);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa80);
  return;
}

Assistant:

void do_decode(const string &inp, FreqTable &freqs, robin_hood::unordered_map<string, char2double> &tMap, robin_hood::unordered_map<string, vector<string>> &motif,
               nlohmann::json &config, int &codewordLen, list<tuple<string, vector<unsigned char>>> &results, std::mutex *res_lock) {
    string metric_str = "ERR";
    vector<unsigned char> data = {};
    try {
        ECdecoding ecDec = ECdecoding(inp, freqs, tMap, true, config);
        SeqEntry dec = ecDec.decode(codewordLen, motif, config);
        metric_str = to_string(dec.metric);
        data = *dec.ac.bitout.get_data();
    }
    catch (...) {
        WARN("No candidate found.");
    }
    {
        std::unique_lock<std::mutex> uLock(*res_lock);
        results.emplace_back(metric_str, data);
    }
}